

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprVectorSize(Expr *pExpr)

{
  u8 uVar1;
  
  uVar1 = pExpr->op;
  if (uVar1 == 0xb0) {
    uVar1 = pExpr->op2;
  }
  if (uVar1 != 0xb1) {
    if (uVar1 != 0x8b) {
      return 1;
    }
    pExpr = (Expr *)(pExpr->x).pSelect;
  }
  return ((anon_union_8_2_a01b6dbf_for_x *)&((Select *)pExpr)->pEList)->pList->nExpr;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprVectorSize(const Expr *pExpr){
  u8 op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return pExpr->x.pList->nExpr;
  }else if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    return pExpr->x.pSelect->pEList->nExpr;
  }else{
    return 1;
  }
}